

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

size_t __thiscall Memory::Recycler::BackgroundFinishMark(Recycler *this)

{
  ObservableValueObserver<Memory::CollectionState> *pOVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  size_t sVar5;
  size_t sVar6;
  CollectionState local_30;
  CollectionState local_2c;
  
  if (this->inPartialCollectMode == false) {
    bVar3 = DoQueueTrackedObject(this);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x162d,"(this->inPartialCollectMode || this->DoQueueTrackedObject())",
                         "this->inPartialCollectMode || this->DoQueueTrackedObject()");
      if (!bVar3) goto LAB_0071f2c2;
      *puVar4 = 0;
    }
  }
  if ((this->collectionState).value != CollectionStateConcurrentFinishMark) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1631,"(collectionState == CollectionStateConcurrentFinishMark)",
                       "collectionState == CollectionStateConcurrentFinishMark");
    if (!bVar3) {
LAB_0071f2c2:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  sVar5 = FinishMarkRescan(this,true);
  local_2c = CollectionStateConcurrentFindRoots;
  pOVar1 = (this->collectionState).observer;
  if ((pOVar1 != (ObservableValueObserver<Memory::CollectionState> *)0x0) &&
     ((this->collectionState).value != CollectionStateConcurrentFindRoots)) {
    (**pOVar1->_vptr_ObservableValueObserver)(pOVar1,&local_2c,&this->collectionState);
  }
  (this->collectionState).value = local_2c;
  sVar6 = BackgroundFindRoots(this);
  local_30 = CollectionStateConcurrentFinishMark;
  pOVar1 = (this->collectionState).observer;
  if ((pOVar1 != (ObservableValueObserver<Memory::CollectionState> *)0x0) &&
     ((this->collectionState).value != CollectionStateConcurrentFinishMark)) {
    (**pOVar1->_vptr_ObservableValueObserver)(pOVar1,&local_30,&this->collectionState);
  }
  (this->collectionState).value = local_30;
  ProcessMark(this,false);
  return sVar6 + sVar5 * 0x1000;
}

Assistant:

size_t
Recycler::BackgroundFinishMark()
{
#if ENABLE_PARTIAL_GC
    Assert(this->inPartialCollectMode || this->DoQueueTrackedObject());
#else
    Assert(this->DoQueueTrackedObject());
#endif
    Assert(collectionState == CollectionStateConcurrentFinishMark);
    size_t rescannedRootBytes = FinishMarkRescan(true) * AutoSystemInfo::PageSize;
    this->SetCollectionState(CollectionStateConcurrentFindRoots);
    rescannedRootBytes += this->BackgroundFindRoots();
    this->SetCollectionState(CollectionStateConcurrentFinishMark);
    RECYCLER_PROFILE_EXEC_BACKGROUND_BEGIN(this, Js::MarkPhase);
    ProcessMark(true);
    RECYCLER_PROFILE_EXEC_BACKGROUND_END(this, Js::MarkPhase);
    return rescannedRootBytes;
}